

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O0

bool correctActionContext(ShortcutContext context,QAction *a,QWidget *active_window)

{
  bool bVar1;
  const_iterator o;
  QMenu *pQVar2;
  ulong uVar3;
  QWidget *pQVar4;
  QGraphicsWidget *pQVar5;
  QAction *in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000008;
  QGraphicsWidget *graphicsWidget;
  QWidget *widget;
  QAction *a_1;
  QMenu *menu;
  QObject *object;
  QObjectList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QObjectList associatedObjects;
  QObject *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QWidget *active_window_00;
  undefined4 in_stack_ffffffffffffffc4;
  byte bVar6;
  const_iterator cVar7;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QAction *)0x0) {
    bVar6 = 0;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAction::associatedObjects();
    active_window_00 = (QWidget *)&local_20;
    local_28.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QObject_*>::begin
                         ((QList<QObject_*> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    o = QList<QObject_*>::end
                  ((QList<QObject_*> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                  );
    while (cVar7.i = o.i, bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_28,o), bVar1)
    {
      QList<QObject_*>::const_iterator::operator*(&local_28);
      pQVar2 = qobject_cast<QMenu*>((QObject *)0x4bed9e);
      if (pQVar2 == (QMenu *)0x0) {
        pQVar4 = qobject_cast<QWidget*>(in_stack_ffffffffffffff68);
        if (pQVar4 == (QWidget *)0x0) {
          pQVar5 = qobject_cast<QGraphicsWidget*>((QObject *)0x4bee55);
          if ((pQVar5 != (QGraphicsWidget *)0x0) &&
             (bVar1 = correctGraphicsWidgetContext
                                ((ShortcutContext)widget,graphicsWidget,in_stack_00000008), bVar1))
          {
            bVar6 = 1;
            goto LAB_004beeae;
          }
        }
        else {
          bVar1 = correctWidgetContext
                            ((ShortcutContext)cVar7.i,(QWidget *)o.i,
                             (QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_EDI));
          if (bVar1) {
            bVar6 = 1;
            goto LAB_004beeae;
          }
        }
      }
      else {
        QMenu::menuAction((QMenu *)0x4bedb5);
        uVar3 = QAction::isVisible();
        if ((((uVar3 & 1) != 0) && (uVar3 = QAction::isEnabled(), (uVar3 & 1) != 0)) &&
           (bVar1 = correctActionContext((ShortcutContext)in_RSI,in_RDX,active_window_00), bVar1)) {
          bVar6 = 1;
          goto LAB_004beeae;
        }
      }
      QList<QObject_*>::const_iterator::operator++(&local_28);
      o.i = cVar7.i;
    }
    bVar6 = 0;
LAB_004beeae:
    QList<QObject_*>::~QList((QList<QObject_*> *)0x4beeb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar6 & 1);
}

Assistant:

static bool correctActionContext(Qt::ShortcutContext context, QAction *a, QWidget *active_window)
{
    if (!active_window)
        return false;

    const QObjectList associatedObjects = a->associatedObjects();
#if defined(DEBUG_QSHORTCUTMAP)
    if (associatedObjects.isEmpty())
        qDebug() << a << "not connected to any widgets; won't trigger";
#endif
    for (auto object : associatedObjects) {
#if QT_CONFIG(menu)
        if (auto menu = qobject_cast<QMenu *>(object)) {
#ifdef Q_OS_DARWIN
            // On Mac, menu item shortcuts are processed before reaching any window.
            // That means that if a menu action shortcut has not been already processed
            // (and reaches this point), then the menu item itself has been disabled.
            // This occurs at the QPA level on Mac, where we disable all the Cocoa menus
            // when showing a modal window. (Notice that only the QPA menu is disabled,
            // not the QMenu.) Since we can also reach this code by climbing the menu
            // hierarchy (see below), or when the shortcut is not a key-equivalent, we
            // need to check whether the QPA menu is actually disabled.
            // When there is no QPA menu, there will be no QCocoaMenuDelegate checking
            // for the actual shortcuts. We can then fallback to our own logic.
            QPlatformMenu *pm = menu->platformMenu();
            if (pm && !pm->isEnabled())
                continue;
#endif
            QAction *a = menu->menuAction();
            if (a->isVisible() && a->isEnabled() && correctActionContext(context, a, active_window))
                return true;
        } else
#endif
        if (auto widget = qobject_cast<QWidget*>(object)) {
            if (correctWidgetContext(context, widget, active_window))
                return true;
        }
#if QT_CONFIG(graphicsview)
        else if (auto graphicsWidget = qobject_cast<QGraphicsWidget*>(object)) {
            if (correctGraphicsWidgetContext(context, graphicsWidget, active_window))
                return true;
        }
#endif
    }

    return false;
}